

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O2

object __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Line<2L>_>::get
          (PythonDataType<anurbs::Model,_anurbs::Line<2L>_> *this,Model *model,size_t index)

{
  handle hVar1;
  
  Model::get<anurbs::Line<2l>>((Model *)&stack0xffffffffffffffe0,index);
  hVar1 = pybind11::detail::type_caster_base<anurbs::Ref<anurbs::Line<2L>_>_>::cast
                    ((itype *)&stack0xffffffffffffffe0,copy,(handle)0x0);
  (this->super_PythonDataTypeBase<anurbs::Model>)._vptr_PythonDataTypeBase =
       (_func_int **)hVar1.m_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return (object)(handle)this;
}

Assistant:

pybind11::object get(const TModel& model, const size_t index)
        override
    {
        return pybind11::cast(model.template get<TData>(index));
    }